

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedEofInputStream::pumpTo
          (DelayedEofInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  Disposer *in_RCX;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<unsigned_long> PVar4;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  (**(code **)(*output[2]._vptr_AsyncOutputStream + 0x18))(&local_50);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_50,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4257:17),_kj::_::PropagateException>
             ::anon_class_16_2_34952053_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00462e40;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
  this_00[1].dependency.disposer = in_RCX;
  local_40.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_40.ptr = (PromiseNode *)this_00;
  OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_30,&local_40);
  pPVar1 = local_40.ptr;
  pCVar2 = OVar3.ptr;
  *(undefined4 *)&(this->super_AsyncInputStream)._vptr_AsyncInputStream = local_30;
  *(undefined4 *)((long)&(this->super_AsyncInputStream)._vptr_AsyncInputStream + 4) = uStack_2c;
  *(undefined4 *)&(this->inner).disposer = uStack_28;
  *(undefined4 *)((long)&(this->inner).disposer + 4) = uStack_24;
  if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    (**(local_40.disposer)->_vptr_Disposer)
              (local_40.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pCVar2 = extraout_RDX;
  }
  pPVar1 = local_50.ptr;
  if (local_50.ptr != (PromiseNode *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    (**(local_50.disposer)->_vptr_Disposer)
              (local_50.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar2 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = &pCVar2->super_PromiseNode;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
      return inner->pumpTo(output, amount)
          .then([this,amount](uint64_t actual) -> kj::Promise<uint64_t> {
        if (actual < amount) {
          // Must have reached EOF.
          KJ_IF_MAYBE(t, completionTask) {
            // Delay until completion.
            auto result = t->then([amount]() { return amount; });
            completionTask = nullptr;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return amount;
          }
        } else {
          return amount;
        }
      });
    }